

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_45a12::MapDrivePlugIn::regenerateMap(MapDrivePlugIn *this)

{
  ulong uVar1;
  long in_RDI;
  GCRoute *in_stack_00000010;
  TerrainMap *in_stack_00000018;
  MapDrivePlugIn *in_stack_00000020;
  size_t i;
  float lastExitRadius;
  size_t exitIndex;
  size_t entryIndex;
  bool upstream;
  size_t count;
  size_type in_stack_ffffffffffffff98;
  PolylineSegmentedPathwaySegmentRadii *in_stack_ffffffffffffffa0;
  TerrainMap *in_stack_ffffffffffffffa8;
  MapDrivePlugIn *in_stack_ffffffffffffffb0;
  TerrainMap *in_stack_ffffffffffffffc8;
  ulong uVar2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  TerrainMap::clear((TerrainMap *)in_stack_ffffffffffffffa0);
  drawRandomClumpsOfRocksOnMap
            ((MapDrivePlugIn *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  clearCenterOfMap(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((anonymous_namespace)::MapDriver::demoSelect < 2) {
    drawBoundaryFencesOnMap
              ((MapDrivePlugIn *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
  }
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    uVar1 = (**(code **)(**(long **)(*(long *)(in_RDI + 8) + 0xf0) + 0x50))();
    OpenSteer::PolylineSegmentedPathwaySegmentRadii::segmentRadius
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      in_stack_ffffffffffffffa0 =
           *(PolylineSegmentedPathwaySegmentRadii **)(*(long *)(in_RDI + 8) + 0xf0);
      OpenSteer::frandom2((float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                          SUB84(in_stack_ffffffffffffffa0,0));
      OpenSteer::PolylineSegmentedPathwaySegmentRadii::setSegmentRadius
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0.0);
    }
    OpenSteer::PolylineSegmentedPathwaySegmentRadii::setSegmentRadius
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0.0);
  }
  if (((*(byte *)(in_RDI + 0x30) & 1) != 0) && ((anonymous_namespace)::MapDriver::demoSelect == 2))
  {
    drawPathFencesOnMap(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  }
  return;
}

Assistant:

void regenerateMap (void)
	{
	    // regenerate map: clear and add random "rocks"
	    vehicle->map->clear();
	    drawRandomClumpsOfRocksOnMap (*vehicle->map);
	    clearCenterOfMap (*vehicle->map);

	    // draw fences for first two demo modes
	    if (vehicle->demoSelect < 2) drawBoundaryFencesOnMap (*vehicle->map);

	    // randomize path widths
	    if (vehicle->demoSelect == 2)
	    {
		const OpenSteer::size_t count = vehicle->path->segmentCount();
		const bool upstream = vehicle->pathFollowDirection > 0;
		const OpenSteer::size_t entryIndex = upstream ? 0 : count-1;
		const OpenSteer::size_t exitIndex  = upstream ? count-1 : 0;
		const float lastExitRadius = vehicle->path->segmentRadius( exitIndex );
		for (OpenSteer::size_t i = 0; i < count; i++)
		{
		    vehicle->path->setSegmentRadius( i, frandom2 (4, 19) );
		}
		vehicle->path->setSegmentRadius( entryIndex, lastExitRadius );
	    }

	    // mark path-boundary map cells as obstacles
	    // (when in path following demo and appropriate mode is set)
	    if (usePathFences && (vehicle->demoSelect == 2))
		drawPathFencesOnMap (*vehicle->map, *vehicle->path);
	}